

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ipstats.cpp
# Opt level: O0

void __thiscall HyperLogLog::ParseHyperLogLog(HyperLogLog *this,char *line,size_t *index)

{
  uint64_t uVar1;
  int local_34;
  int i;
  size_t index_last;
  size_t index_first;
  size_t *index_local;
  char *line_local;
  HyperLogLog *this_local;
  
  index_first = (size_t)index;
  index_local = (size_t *)line;
  line_local = (char *)this;
  ParseCsvCell(line,index,&index_last,(size_t *)&stack0xffffffffffffffd0);
  for (local_34 = 0; local_34 < 0x10; local_34 = local_34 + 1) {
    uVar1 = ParseUint64Cell((char *)index_local,(size_t *)index_first);
    this->hllv[local_34] = (uint8_t)uVar1;
  }
  return;
}

Assistant:

void HyperLogLog::ParseHyperLogLog(char const* line, size_t* index)
{
    /* Skip the float value */
    size_t index_first;
    size_t index_last;
    ParseCsvCell(line, index, &index_first, &index_last);
    for (int i = 0; i < 16; i++) {
        hllv[i] = (uint8_t)ParseUint64Cell(line, index);
    }
}